

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall PeleLM::velocity_diffusion_update(PeleLM *this,Real dt)

{
  Diffusion *this_00;
  MultiFab *rho_half;
  ostream *os_;
  Print *pPVar1;
  bool bVar2;
  double dVar3;
  Real RVar4;
  double dVar5;
  FluxBoxes fb_betanp1;
  FluxBoxes fb_betan;
  Print local_1b8;
  
  if (*NavierStokesBase::is_diffusive.super_vector<int,_std::allocator<int>_>.
       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start != 0)
  {
    dVar3 = amrex::ParallelDescriptor::second();
    RVar4 = amrex::StateData::prevTime
                      ((this->super_NavierStokesBase).super_AmrLevel.state.
                       super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                       super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                       _M_impl.super__Vector_impl_data._M_start);
    bVar2 = NavierStokesBase::do_mom_diff != 0;
    FluxBoxes::FluxBoxes(&fb_betan,(AmrLevel *)this,1,0);
    FluxBoxes::FluxBoxes(&fb_betanp1,(AmrLevel *)this,1,0);
    (*(this->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel[0x32])(RVar4,this,fb_betan.data);
    (*(this->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel[0x32])
              (RVar4 + dt,this,fb_betanp1.data);
    RVar4 = NavierStokesBase::be_cn_theta;
    this_00 = (this->super_NavierStokesBase).diffusion;
    rho_half = NavierStokesBase::get_rho_half_time(&this->super_NavierStokesBase);
    Diffusion::diffuse_velocity
              (this_00,dt,RVar4,rho_half,(uint)bVar2 * 2 + 1,(MultiFab *)0x0,0,fb_betan.data,
               (this->super_NavierStokesBase).viscn_cc,fb_betanp1.data,
               (this->super_NavierStokesBase).viscnp1_cc,0);
    if (2 < NavierStokesBase::verbose) {
      dVar5 = amrex::ParallelDescriptor::second();
      os_ = amrex::OutStream();
      amrex::Print::Print(&local_1b8,os_);
      std::operator<<((ostream *)&local_1b8.ss,"      PeleLM::velocity_diffusion_update(): lev: ");
      pPVar1 = amrex::Print::operator<<
                         (&local_1b8,&(this->super_NavierStokesBase).super_AmrLevel.level);
      std::operator<<((ostream *)&pPVar1->ss,", time: ");
      std::ostream::_M_insert<double>(dVar5 - dVar3);
      std::operator<<((ostream *)&pPVar1->ss,'\n');
      amrex::Print::~Print(&local_1b8);
    }
    FluxBoxes::~FluxBoxes(&fb_betanp1);
    FluxBoxes::~FluxBoxes(&fb_betan);
  }
  return;
}

Assistant:

void
PeleLM::velocity_diffusion_update (Real dt)
{
   BL_PROFILE("PLM::velocity_diffusion_update()");
   //
   // Do implicit c-n solve for velocity
   // compute the viscous forcing
   // do following except at initial iteration--rbp, per jbb
   //
   if (is_diffusive[Xvel])
   {
      const Real strt_time = ParallelDescriptor::second();

      const Real time = state[State_Type].prevTime();

      int rho_flag;
      if (do_mom_diff == 0)
      {
         rho_flag = 1;
      }
      else
      {
         rho_flag = 3;
      }

      MultiFab *delta_rhs = 0;

      FluxBoxes fb_betan(this,1,0);
      FluxBoxes fb_betanp1(this,1,0);
      MultiFab** betan = fb_betan.get();
      MultiFab** betanp1 = fb_betanp1.get();
      getViscosity(betan, time);
      getViscosity(betanp1, time+dt);

      int rhsComp  = 0;
      int betaComp = 0;
      diffusion->diffuse_velocity(dt,be_cn_theta,get_rho_half_time(),rho_flag,
                                  delta_rhs,rhsComp,betan,viscn_cc,
                                  betanp1,viscnp1_cc,betaComp);

      delete delta_rhs;

      if (verbose > 2)
      {
        const int IOProc   = ParallelDescriptor::IOProcessorNumber();
        Real      run_time = ParallelDescriptor::second() - strt_time;

        ParallelDescriptor::ReduceRealMax(run_time,IOProc);

        amrex::Print() << "      PeleLM::velocity_diffusion_update(): lev: " << level
                       << ", time: " << run_time << '\n';
      }
  }
}